

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,xmlSchemaTypePtr type)

{
  int local_24;
  int ret;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  ctxt_local._4_4_ = xmlSchemaCheckCTPropsCorrect(ctxt,type);
  if (ctxt_local._4_4_ == 0) {
    if ((type->flags & 2U) == 0) {
      local_24 = xmlSchemaCheckDerivationOKRestriction(ctxt,type);
    }
    else {
      local_24 = xmlSchemaCheckCOSCTExtends(ctxt,type);
    }
    ctxt_local._4_4_ = local_24;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,
			  xmlSchemaTypePtr type)
{
    int ret;
    /*
    * Complex Type Definition Properties Correct
    */
    ret = xmlSchemaCheckCTPropsCorrect(ctxt, type);
    if (ret != 0)
	return (ret);
    if (WXS_IS_EXTENSION(type))
	ret = xmlSchemaCheckCOSCTExtends(ctxt, type);
    else
	ret = xmlSchemaCheckDerivationOKRestriction(ctxt, type);
    return (ret);
}